

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O2

void __thiscall QSynth::setOutputGain(QSynth *this,float outputGain)

{
  QMutexLocker<QMutex> synthLocker;
  QMutexLocker<QMutex> local_18;
  
  if (this->realtimeHelper != (RealtimeHelper *)0x0) {
    RealtimeHelper::setOutputGain(this->realtimeHelper,outputGain);
    return;
  }
  QMutexLocker<QMutex>::QMutexLocker(&local_18,this->synthMutex);
  if (this->state == SynthState_OPEN) {
    MT32Emu::Synth::setOutputGain(this->synth,outputGain);
  }
  QMutexLocker<QMutex>::unlock(&local_18);
  return;
}

Assistant:

void QSynth::setOutputGain(float outputGain) {
	if (isRealtime()) {
		realtimeHelper->setOutputGain(outputGain);
	} else {
		QMutexLocker synthLocker(synthMutex);
		if (isOpen()) synth->setOutputGain(outputGain);
	}
}